

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int iVar1;
  int local_44;
  size_t sStack_40;
  int r;
  size_t used;
  xar *xar;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  sStack_40 = 0;
  used = (size_t)a->format->data;
  xar = (xar *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (*(long *)(used + 0x1e8) != 0) {
    __archive_read_consume(a,*(int64_t *)(used + 0x1e8));
    *(undefined8 *)(used + 0x1e8) = 0;
  }
  if ((*(int *)(used + 0x18) == 0) && (*(long *)(used + 0x1e0) != 0)) {
    if (*(int *)(used + 0x1d0) != 0) {
      iVar1 = rd_contents_init((archive_read *)buff_local,*(enctype *)(used + 0x1f8),
                               *(int *)(used + 0x200),*(int *)(used + 0x228));
      if (iVar1 != 0) {
        *(undefined8 *)(used + 0x1e0) = 0;
        return iVar1;
      }
      *(undefined4 *)(used + 0x1d0) = 0;
    }
    *size_local = 0;
    local_44 = rd_contents((archive_read *)buff_local,(void **)size_local,(size_t *)offset_local,
                           &stack0xffffffffffffffc0,*(uint64_t *)(used + 0x1e0));
    if (local_44 == 0) {
      xar->offset = *(uint64_t *)(used + 0x1d8);
      *(int64_t *)(used + 0x1d8) = *offset_local + *(long *)(used + 0x1d8);
      *(int64_t *)(used + 8) = *offset_local + *(long *)(used + 8);
      *(size_t *)used = sStack_40 + *(long *)used;
      *(size_t *)(used + 0x1e0) = *(long *)(used + 0x1e0) - sStack_40;
      *(size_t *)(used + 0x1e8) = sStack_40;
      if (*(long *)(used + 0x1e0) != 0) {
        return 0;
      }
      if (*(long *)(used + 0x1d8) == *(long *)(used + 0x1f0)) {
        local_44 = checksum_final((archive_read *)buff_local,(void *)(used + 0x210),
                                  *(size_t *)(used + 0x208),(void *)(used + 0x238),
                                  *(size_t *)(used + 0x230));
        if (local_44 == 0) {
          return 0;
        }
      }
      else {
        archive_set_error((archive *)buff_local,-1,"Decompressed size error");
        local_44 = -0x1e;
      }
    }
  }
  else {
    local_44 = 1;
  }
  *size_local = 0;
  *offset_local = 0;
  xar->offset = *(uint64_t *)(used + 8);
  return local_44;
}

Assistant:

static int
xar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct xar *xar;
	size_t used = 0;
	int r;

	xar = (struct xar *)(a->format->data);

	if (xar->entry_unconsumed) {
		__archive_read_consume(a, xar->entry_unconsumed);
		xar->entry_unconsumed = 0;
	}

	if (xar->end_of_file || xar->entry_remaining <= 0) {
		r = ARCHIVE_EOF;
		goto abort_read_data;
	}

	if (xar->entry_init) {
		r = rd_contents_init(a, xar->entry_encoding,
		    xar->entry_a_sum.alg, xar->entry_e_sum.alg);
		if (r != ARCHIVE_OK) {
			xar->entry_remaining = 0;
			return (r);
		}
		xar->entry_init = 0;
	}

	*buff = NULL;
	r = rd_contents(a, buff, size, &used, xar->entry_remaining);
	if (r != ARCHIVE_OK)
		goto abort_read_data;

	*offset = xar->entry_total;
	xar->entry_total += *size;
	xar->total += *size;
	xar->offset += used;
	xar->entry_remaining -= used;
	xar->entry_unconsumed = used;

	if (xar->entry_remaining == 0) {
		if (xar->entry_total != xar->entry_size) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Decompressed size error");
			r = ARCHIVE_FATAL;
			goto abort_read_data;
		}
		r = checksum_final(a,
		    xar->entry_a_sum.val, xar->entry_a_sum.len,
		    xar->entry_e_sum.val, xar->entry_e_sum.len);
		if (r != ARCHIVE_OK)
			goto abort_read_data;
	}

	return (ARCHIVE_OK);
abort_read_data:
	*buff = NULL;
	*size = 0;
	*offset = xar->total;
	return (r);
}